

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

void __thiscall tinyxml2::XMLPrinter::PrintString(XMLPrinter *this,char *p,bool restricted)

{
  byte bVar1;
  size_t size;
  long lVar2;
  byte *pbVar3;
  size_t size_00;
  
  if (this->_processEntities != true) {
    size_00 = strlen(p);
LAB_0010d82f:
    Write(this,p,size_00);
    return;
  }
  bVar1 = *p;
  if (bVar1 != 0) {
    pbVar3 = (byte *)p;
    do {
      if ((bVar1 < 0x40) && (this->_entityFlag[(ulong)bVar1 + (ulong)restricted * 0x40] == true)) {
        if (p < pbVar3) {
          do {
            size = (long)pbVar3 - (long)p;
            if (0x7ffffffe < size) {
              size = 0x7fffffff;
            }
            Write(this,p,size);
            p = (char *)((byte *)p + size);
          } while (p < pbVar3);
          bVar1 = *pbVar3;
        }
        lVar2 = 0xc;
        do {
          if (*(byte *)((long)&entities + lVar2) == bVar1) {
            Putc(this,'&');
            Write(this,*(char **)((long)&__frame_dummy_init_array_entry + lVar2 + 4),
                  (long)*(int *)((long)&__do_global_dtors_aux_fini_array_entry + lVar2 + 4));
            Putc(this,';');
            break;
          }
          lVar2 = lVar2 + 0x10;
        } while (lVar2 != 0x5c);
        p = (char *)((byte *)p + 1);
      }
      bVar1 = pbVar3[1];
      pbVar3 = pbVar3 + 1;
    } while (bVar1 != 0);
    if (p < pbVar3) {
      size_00 = (long)pbVar3 - (long)p;
      if (0x7ffffffe < size_00) {
        size_00 = 0x7fffffff;
      }
      goto LAB_0010d82f;
    }
  }
  return;
}

Assistant:

void XMLPrinter::PrintString( const char* p, bool restricted )
{
    // Look for runs of bytes between entities to print.
    const char* q = p;

    if ( _processEntities ) {
        const bool* flag = restricted ? _restrictedEntityFlag : _entityFlag;
        while ( *q ) {
            TIXMLASSERT( p <= q );
            // Remember, char is sometimes signed. (How many times has that bitten me?)
            if ( *q > 0 && *q < ENTITY_RANGE ) {
                // Check for entities. If one is found, flush
                // the stream up until the entity, write the
                // entity, and keep looking.
                if ( flag[(unsigned char)(*q)] ) {
                    while ( p < q ) {
                        const size_t delta = q - p;
                        const int toPrint = ( INT_MAX < delta ) ? INT_MAX : (int)delta;
                        Write( p, toPrint );
                        p += toPrint;
                    }
                    bool entityPatternPrinted = false;
                    for( int i=0; i<NUM_ENTITIES; ++i ) {
                        if ( entities[i].value == *q ) {
                            Putc( '&' );
                            Write( entities[i].pattern, entities[i].length );
                            Putc( ';' );
                            entityPatternPrinted = true;
                            break;
                        }
                    }
                    if ( !entityPatternPrinted ) {
                        // TIXMLASSERT( entityPatternPrinted ) causes gcc -Wunused-but-set-variable in release
                        TIXMLASSERT( false );
                    }
                    ++p;
                }
            }
            ++q;
            TIXMLASSERT( p <= q );
        }
        // Flush the remaining string. This will be the entire
        // string if an entity wasn't found.
        if ( p < q ) {
            const size_t delta = q - p;
            const int toPrint = ( INT_MAX < delta ) ? INT_MAX : (int)delta;
            Write( p, toPrint );
        }
    }
    else {
        Write( p );
    }
}